

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O1

AdaptiveSnifferResult * __thiscall
duckdb::CSVSniffer::MinimalSniff(AdaptiveSnifferResult *__return_storage_ptr__,CSVSniffer *this)

{
  OpenFileInfo *pOVar1;
  unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
  *set_columns;
  vector<duckdb::LogicalType,_true> *this_00;
  idx_t iVar2;
  CSVReaderOptions *pCVar3;
  anon_union_16_2_67f50693_for_value *paVar4;
  unsigned_long *puVar5;
  CSVSniffer *pCVar6;
  CSVReaderOptions *options;
  CSVIterator iterator;
  int iVar7;
  CSVBufferManager *pCVar8;
  reference pvVar9;
  CSVStateMachine *pCVar10;
  pointer pSVar11;
  CSVErrorHandler *this_01;
  undefined4 extraout_var;
  DataChunk *data_chunk;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *pvVar12;
  type pCVar13;
  reference vector;
  MultiFileOptions *file_options;
  mapped_type *pmVar14;
  reference other;
  long lVar15;
  vector<duckdb::ColumnCount,_true> *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  CSVIterator *pCVar17;
  idx_t *piVar18;
  size_type __n;
  byte bVar19;
  unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
  scanner;
  shared_ptr<duckdb::CSVStateMachine,_true> state_machine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  vector<duckdb::HeaderValue,_true> potential_header;
  vector<duckdb::LogicalType,_true> return_types;
  ColumnCountScanner count_scanner;
  idx_t in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  CSVErrorHandler *in_stack_fffffffffffffbc0;
  undefined1 auVar20 [32];
  undefined1 in_stack_fffffffffffffbc8 [40];
  undefined1 local_410 [32];
  CSVSniffer *local_3f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e8;
  element_type *local_3e0;
  undefined1 local_3d8 [8];
  _Alloc_hider local_3d0;
  element_type *local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  shared_ptr<duckdb::CSVErrorHandler,_true> local_3b0;
  shared_ptr<duckdb::CSVBufferManager,_true> local_3a0;
  undefined1 local_390 [8];
  _Alloc_hider local_388;
  char local_378 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  undefined1 local_358 [40];
  _Head_base<0UL,_duckdb::RegisteredStateManager_*,_false> local_330;
  _Head_base<0UL,_duckdb::Logger_*,_false> local_328;
  LogicalType local_320;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2e8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_288;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_268;
  CSVIterator local_248;
  ColumnCountScanner local_200;
  
  bVar19 = 0;
  pvVar12 = &((this->set_columns).types)->
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
  local_410._8_8_ = __return_storage_ptr__;
  if ((pvVar12 == (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x0) ||
     ((pvVar12->super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (pvVar12->super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      _M_impl.super__Vector_impl_data._M_finish)) {
    local_308.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pCVar8 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&this->buffer_manager);
    pCVar8->sniffing = true;
    local_200.super_BaseScanner._vptr_BaseScanner = (_func_int **)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::CSVStateMachine,std::allocator<duckdb::CSVStateMachine>,duckdb::CSVReaderOptions&,duckdb::CSVStateMachineOptions&,duckdb::CSVStateMachineCache&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_200.super_BaseScanner.csv_file_scan,(CSVStateMachine **)&local_200,
               (allocator<duckdb::CSVStateMachine> *)local_3d8,this->options,
               (CSVStateMachineOptions *)this->options,this->state_machine_cache);
    local_410._16_8_ = local_200.super_BaseScanner._vptr_BaseScanner;
    local_410._24_8_ =
         local_200.super_BaseScanner.csv_file_scan.internal.
         super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (local_200.super_BaseScanner.csv_file_scan.internal.
        super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        pOVar1 = &((local_200.super_BaseScanner.csv_file_scan.internal.
                    super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_BaseFileReader).file;
        *(int *)&(pOVar1->path)._M_dataplus._M_p = *(int *)&(pOVar1->path)._M_dataplus._M_p + 1;
        UNLOCK();
      }
      else {
        pOVar1 = &((local_200.super_BaseScanner.csv_file_scan.internal.
                    super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_BaseFileReader).file;
        *(int *)&(pOVar1->path)._M_dataplus._M_p = *(int *)&(pOVar1->path)._M_dataplus._M_p + 1;
      }
    }
    if (local_200.super_BaseScanner.csv_file_scan.internal.
        super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_200.super_BaseScanner.csv_file_scan.internal.
                 super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    local_3a0.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (this->buffer_manager).internal.
             super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3a0.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->buffer_manager).internal.
         super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_3a0.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_3a0.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_3a0.internal.
              super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_3a0.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_3a0.internal.
              super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    local_3b0.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (this->error_handler).internal.
             super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3b0.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->error_handler).internal.
         super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_3b0.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_3b0.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_3b0.internal.
              super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_3b0.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_3b0.internal.
              super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    CSVIterator::CSVIterator(&local_248);
    pCVar17 = &local_248;
    piVar18 = (idx_t *)&stack0xfffffffffffffba8;
    for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
      *piVar18 = (pCVar17->pos).buffer_idx;
      pCVar17 = (CSVIterator *)((long)pCVar17 + ((ulong)bVar19 * -2 + 1) * 8);
      piVar18 = piVar18 + (ulong)bVar19 * -2 + 1;
    }
    iterator.pos.buffer_pos = in_stack_fffffffffffffbb0;
    iterator.pos.buffer_idx = in_stack_fffffffffffffba8;
    iterator.done = (bool)(char)in_stack_fffffffffffffbb8;
    iterator.first_one = (bool)(char)((ulong)in_stack_fffffffffffffbb8 >> 8);
    iterator._18_6_ = (int6)((ulong)in_stack_fffffffffffffbb8 >> 0x10);
    iterator.buffer_size = (idx_t)in_stack_fffffffffffffbc0;
    auVar20 = in_stack_fffffffffffffbc8._0_32_;
    iterator.boundary.buffer_idx = auVar20._0_8_;
    iterator.boundary.buffer_pos = auVar20._8_8_;
    iterator.boundary.boundary_idx = auVar20._16_8_;
    iterator.boundary.end_pos = auVar20._24_8_;
    iterator.is_set = (bool)in_stack_fffffffffffffbc8[0x20];
    iterator._65_7_ = in_stack_fffffffffffffbc8._33_7_;
    ColumnCountScanner::ColumnCountScanner
              (&local_200,&local_3a0,(shared_ptr<duckdb::CSVStateMachine,_true> *)(local_410 + 0x10)
               ,&local_3b0,0x800,iterator);
    local_3f0 = this;
    if (local_3b0.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3b0.internal.
                 super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    if (local_3a0.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3a0.internal.
                 super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_3e8._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ColumnCountScanner::ParseChunk(&local_200);
    if (((ColumnCountResult *)local_3e8._M_pi)->result_position == 0) {
      local_268.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_268.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_268.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_288.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_288.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      AdaptiveSnifferResult::AdaptiveSnifferResult
                ((AdaptiveSnifferResult *)local_410._8_8_,
                 (vector<duckdb::LogicalType,_true> *)&local_268,&local_288,false);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_288);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_268);
    }
    else {
      this_02 = &((ColumnCountResult *)local_3e8._M_pi)->column_counts;
      pvVar9 = vector<duckdb::ColumnCount,_true>::operator[](this_02,0);
      iVar2 = pvVar9->number_of_columns;
      pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                          ((shared_ptr<duckdb::CSVStateMachine,_true> *)(local_410 + 0x10));
      (pCVar10->dialect_options).num_cols = iVar2;
      pvVar9 = vector<duckdb::ColumnCount,_true>::operator[](this_02,0);
      pCVar6 = local_3f0;
      (local_3f0->options->dialect_options).num_cols = pvVar9->number_of_columns;
      ColumnCountScanner::UpgradeToStringValueScanner((ColumnCountScanner *)local_410);
      pSVar11 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                              *)local_410);
      this_01 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                          (&(pSVar11->super_BaseScanner).error_handler);
      CSVErrorHandler::SetIgnoreErrors(this_01,true);
      local_328._M_head_impl = (Logger *)&this->buffer_manager;
      pSVar11 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                              *)local_410);
      iVar7 = (*(pSVar11->super_BaseScanner)._vptr_BaseScanner[2])(pSVar11);
      data_chunk = StringValueResult::ToChunk((StringValueResult *)CONCAT44(extraout_var,iVar7));
      local_358._32_8_ = &pCVar6->set_columns;
      local_330._M_head_impl = (RegisteredStateManager *)&pCVar6->error_handler;
      local_368._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (ulong)(*(idx_t *)&local_3e8._M_pi[6]._M_use_count == 2);
      set_columns = &pCVar6->best_sql_types_candidates_per_column_idx;
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      while (local_3d8 = (undefined1  [8])p_Var16,
            pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                                ((shared_ptr<duckdb::CSVStateMachine,_true> *)(local_410 + 0x10)),
            p_Var16 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (pCVar10->dialect_options).num_cols) {
        pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                            ((shared_ptr<duckdb::CSVStateMachine,_true> *)(local_410 + 0x10));
        pCVar3 = pCVar10->options;
        pvVar12 = &::std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)set_columns,(key_type *)local_3d8)->
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                  (pvVar12,&(pCVar3->auto_type_candidates).
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
        ;
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)(_func_int ***)local_3d8 + 1);
      }
      pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator*
                          ((shared_ptr<duckdb::CSVStateMachine,_true> *)(local_410 + 0x10));
      SniffTypes(pCVar6,data_chunk,pCVar13,set_columns,(idx_t)local_368._M_pi);
      local_358._0_8_ = (element_type *)0x0;
      local_358._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_358._16_8_ = (element_type *)0x0;
      if ((data_chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (data_chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __n = 0;
        do {
          vector = vector<duckdb::Vector,_true>::operator[](&data_chunk->data,__n);
          paVar4 = (anon_union_16_2_67f50693_for_value *)vector->data;
          FlatVector::VerifyFlatVector(vector);
          local_3d8[0] = 1;
          local_3c8 = (element_type *)0x0;
          local_3c0._M_local_buf[0] = '\0';
          puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          local_3d0._M_p = (pointer)&local_3c0;
          if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
            HeaderValue::HeaderValue((HeaderValue *)local_390,(string_t)paVar4->pointer);
            local_3d8[0] = local_390[0];
            ::std::__cxx11::string::operator=((string *)&local_3d0,(string *)&local_388);
            if (local_388._M_p != local_378) {
              operator_delete(local_388._M_p);
            }
          }
          ::std::vector<duckdb::HeaderValue,std::allocator<duckdb::HeaderValue>>::
          emplace_back<duckdb::HeaderValue&>
                    ((vector<duckdb::HeaderValue,std::allocator<duckdb::HeaderValue>> *)local_358,
                     (HeaderValue *)local_3d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d0._M_p != &local_3c0) {
            operator_delete(local_3d0._M_p);
          }
          __n = __n + 1;
        } while (__n < (ulong)(((long)(data_chunk->data).
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(data_chunk->data).
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              0x4ec4ec4ec4ec4ec5));
      }
      pCVar8 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                         ((shared_ptr<duckdb::CSVBufferManager,_true> *)local_328._M_head_impl);
      pCVar6 = (CSVSniffer *)pCVar8->context;
      pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator*
                          ((shared_ptr<duckdb::CSVStateMachine,_true> *)(local_410 + 0x10));
      pCVar3 = local_3f0->options;
      options = (CSVReaderOptions *)local_3f0->file_options;
      file_options = (MultiFileOptions *)
                     shared_ptr<duckdb::CSVErrorHandler,_true>::operator*
                               ((shared_ptr<duckdb::CSVErrorHandler,_true> *)local_330._M_head_impl)
      ;
      DetectHeaderInternal_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_3d8,pCVar6,(ClientContext *)local_358,
                 (vector<duckdb::HeaderValue,_true> *)pCVar13,(CSVStateMachine *)local_358._32_8_,
                 (SetColumns *)set_columns,
                 (unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                  *)pCVar3,options,file_options,in_stack_fffffffffffffbc0);
      pCVar6 = local_3f0;
      local_3e0 = (element_type *)0x0;
      if ((local_3f0->best_sql_types_candidates_per_column_idx)._M_h._M_element_count != 0) {
        this_00 = &local_3f0->detected_types;
        do {
          pmVar14 = ::std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)set_columns,(key_type *)&local_3e0);
          other = vector<duckdb::LogicalType,_true>::back(pmVar14);
          LogicalType::LogicalType((LogicalType *)local_390,other);
          pmVar14 = ::std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)set_columns,(key_type *)&local_3e0);
          if ((long)(pmVar14->
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pmVar14->
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
              (long)(pCVar6->options->auto_type_candidates).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar6->options->auto_type_candidates).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
            LogicalType::LogicalType(&local_320,VARCHAR);
            LogicalType::~LogicalType(&local_320);
          }
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&this_00->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                     (LogicalType *)local_390);
          LogicalType::~LogicalType((LogicalType *)local_390);
          local_3e0 = (element_type *)((long)&local_3e0->transition_array + 1);
        } while (local_3e0 <
                 (element_type *)
                 (pCVar6->best_sql_types_candidates_per_column_idx)._M_h._M_element_count);
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_2d0,
                 &(pCVar6->detected_types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_2e8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3d8);
      AdaptiveSnifferResult::AdaptiveSnifferResult
                ((AdaptiveSnifferResult *)local_410._8_8_,
                 (vector<duckdb::LogicalType,_true> *)&local_2d0,&local_2e8,
                 1 < *(ulong *)&local_3e8._M_pi[6]._M_use_count);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_2e8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2d0);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3d8);
      ::std::vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>::~vector
                ((vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_> *)local_358);
      if ((tuple<duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>)
          local_410._0_8_ != (_Head_base<0UL,_duckdb::StringValueScanner_*,_false>)0x0) {
        (**(code **)(*(_func_int **)local_410._0_8_ + 8))();
      }
    }
    local_200.super_BaseScanner._vptr_BaseScanner = (_func_int **)&PTR__ColumnCountScanner_019cc8f0;
    ::std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
    ::~_Rb_tree(&local_200.result.buffer_handles._M_t);
    ::std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::~_Rb_tree(&local_200.result.rows_per_column_count._M_t);
    if ((ActiveQueryContext *)
        local_200.result.column_counts.
        super_vector<duckdb::ColumnCount,_std::allocator<duckdb::ColumnCount>_>.
        super__Vector_base<duckdb::ColumnCount,_std::allocator<duckdb::ColumnCount>_>._M_impl.
        super__Vector_impl_data._M_start != (ActiveQueryContext *)0x0) {
      operator_delete(local_200.result.column_counts.
                      super_vector<duckdb::ColumnCount,_std::allocator<duckdb::ColumnCount>_>.
                      super__Vector_base<duckdb::ColumnCount,_std::allocator<duckdb::ColumnCount>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    BaseScanner::~BaseScanner(&local_200.super_BaseScanner);
    if ((element_type *)local_410._24_8_ != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_410._24_8_);
    }
    pvVar12 = &local_308;
  }
  else {
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_2a0,pvVar12);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2b8,
             &((this->set_columns).names)->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    AdaptiveSnifferResult::AdaptiveSnifferResult
              ((AdaptiveSnifferResult *)local_410._8_8_,
               (vector<duckdb::LogicalType,_true> *)&local_2a0,&local_2b8,true);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_2b8);
    pvVar12 = &local_2a0;
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(pvVar12);
  return (AdaptiveSnifferResult *)(element_type *)local_410._8_8_;
}

Assistant:

AdaptiveSnifferResult CSVSniffer::MinimalSniff() {
	if (set_columns.IsSet()) {
		// Nothing to see here
		return AdaptiveSnifferResult(*set_columns.types, *set_columns.names, true);
	}
	// Return Types detected
	vector<LogicalType> return_types;
	// Column Names detected
	buffer_manager->sniffing = true;
	constexpr idx_t result_size = STANDARD_VECTOR_SIZE;

	auto state_machine =
	    make_shared_ptr<CSVStateMachine>(options, options.dialect_options.state_machine_options, state_machine_cache);
	ColumnCountScanner count_scanner(buffer_manager, state_machine, error_handler, result_size);
	auto &sniffed_column_counts = count_scanner.ParseChunk();
	if (sniffed_column_counts.result_position == 0) {
		// The file is an empty file, we just return
		return {{}, {}, false};
	}

	state_machine->dialect_options.num_cols = sniffed_column_counts[0].number_of_columns;
	options.dialect_options.num_cols = sniffed_column_counts[0].number_of_columns;

	// First figure out the number of columns on this configuration
	auto scanner = count_scanner.UpgradeToStringValueScanner();
	scanner->error_handler->SetIgnoreErrors(true);
	// Parse chunk and read csv with info candidate
	auto &data_chunk = scanner->ParseChunk().ToChunk();
	idx_t start_row = 0;
	if (sniffed_column_counts.result_position == 2) {
		// If equal to two, we will only use the second row for type checking
		start_row = 1;
	}

	// Gather Types
	for (idx_t i = 0; i < state_machine->dialect_options.num_cols; i++) {
		best_sql_types_candidates_per_column_idx[i] = state_machine->options.auto_type_candidates;
	}
	SniffTypes(data_chunk, *state_machine, best_sql_types_candidates_per_column_idx, start_row);

	// Possibly Gather Header
	vector<HeaderValue> potential_header;
	for (idx_t col_idx = 0; col_idx < data_chunk.ColumnCount(); col_idx++) {
		auto &cur_vector = data_chunk.data[col_idx];
		const auto vector_data = FlatVector::GetData<string_t>(cur_vector);
		auto &validity = FlatVector::Validity(cur_vector);
		HeaderValue val;
		if (validity.RowIsValid(0)) {
			val = HeaderValue(vector_data[0]);
		}
		potential_header.emplace_back(val);
	}

	auto names = DetectHeaderInternal(buffer_manager->context, potential_header, *state_machine, set_columns,
	                                  best_sql_types_candidates_per_column_idx, options, file_options, *error_handler);

	for (idx_t column_idx = 0; column_idx < best_sql_types_candidates_per_column_idx.size(); column_idx++) {
		LogicalType d_type = best_sql_types_candidates_per_column_idx[column_idx].back();
		if (best_sql_types_candidates_per_column_idx[column_idx].size() == options.auto_type_candidates.size()) {
			d_type = LogicalType::VARCHAR;
		}
		detected_types.push_back(d_type);
	}
	return {detected_types, names, sniffed_column_counts.result_position > 1};
}